

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O2

bool __thiscall ArmParser::parseImmediate(ArmParser *this,Parser *parser,Expression *dest)

{
  ArmRegisterValue *dest_00;
  _List_node_base *p_Var1;
  bool bVar2;
  ArmOpcodeVariables *this_00;
  Expression local_290;
  ArmOpcodeVariables tempVars;
  
  p_Var1 = (((parser->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node;
  this_00 = &tempVars;
  ArmOpcodeVariables::ArmOpcodeVariables(&tempVars);
  bVar2 = parsePsrTransfer((ArmParser *)this_00,parser,&tempVars,false);
  if (!bVar2) {
    (((parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var1;
    dest_00 = &tempVars.rd;
    bVar2 = parseRegister((ArmParser *)this_00,parser,dest_00,0xf);
    if (!bVar2) {
      (((parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var1;
      bVar2 = parseCopNumber((ArmParser *)this_00,parser,dest_00);
      if (!bVar2) {
        (((parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var1;
        bVar2 = parseCopRegister((ArmParser *)this_00,parser,dest_00);
        if (!bVar2) {
          (((parser->entries).
            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var1;
          Parser::parseExpression(&local_290,parser);
          Expression::operator=(dest,&local_290);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_290.expression.
                      super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                    );
          bVar2 = (dest->expression).
                  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0;
          goto LAB_00153a5a;
        }
      }
    }
  }
  bVar2 = false;
LAB_00153a5a:
  ArmOpcodeVariables::~ArmOpcodeVariables(&tempVars);
  return bVar2;
}

Assistant:

bool ArmParser::parseImmediate(Parser& parser, Expression& dest)
{
	TokenizerPosition pos = parser.getTokenizer()->getPosition();

	// check if it really is an immediate
	ArmOpcodeVariables tempVars;
	if (parsePsrTransfer(parser,tempVars,false))
		return false;

	parser.getTokenizer()->setPosition(pos);
	if (parseRegister(parser,tempVars.rd))
		return false;
	
	parser.getTokenizer()->setPosition(pos);
	if (parseCopNumber(parser,tempVars.rd))
		return false;
	
	parser.getTokenizer()->setPosition(pos);
	if (parseCopRegister(parser,tempVars.rd))
		return false;
	
	parser.getTokenizer()->setPosition(pos);
	dest = parser.parseExpression();
	return dest.isLoaded();
}